

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_points.cpp
# Opt level: O2

Am_Point_List * __thiscall Am_Point_List::operator=(Am_Point_List *this,Am_Point_List *prev)

{
  uint *puVar1;
  Am_Point_List_Data *pAVar2;
  
  if (this->data != (Am_Point_List_Data *)0x0) {
    Am_Wrapper::Release(&this->data->super_Am_Wrapper);
  }
  pAVar2 = prev->data;
  this->data = pAVar2;
  this->item = prev->item;
  if (pAVar2 != (Am_Point_List_Data *)0x0) {
    puVar1 = &(pAVar2->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
  }
  return this;
}

Assistant:

Am_Point_List &
Am_Point_List::operator=(const Am_Point_List &prev)
{
  if (data)
    data->Release();
  data = prev.data;
  item = prev.item;
  if (data)
    data->Note_Reference();
  return *this;
}